

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcQuant.c
# Opt level: O2

Abc_Ntk_t * Abc_NtkReachability(Abc_Ntk_t *pNtkRel,int nIters,int fVerbose)

{
  ulong uVar1;
  int iVar2;
  Abc_Ntk_t *pAVar3;
  Abc_Ntk_t *pNtk;
  Abc_Obj_t *pAVar4;
  Abc_Obj_t *pAVar5;
  Abc_Ntk_t *pNtk2;
  abctime aVar6;
  undefined8 uVar7;
  uint uVar8;
  int i;
  uint uVar9;
  Abc_Ntk_t *pNtkNext;
  Abc_Ntk_t *pNtkReached;
  uint local_64;
  uint local_60;
  int local_5c;
  uint local_58;
  int local_54;
  Abc_Ntk_t *local_50;
  ulong local_48;
  Abc_Ntk_t *local_40;
  abctime local_38;
  
  local_5c = fVerbose;
  if (pNtkRel->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtkRel)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcQuant.c"
                  ,0x150,"Abc_Ntk_t *Abc_NtkReachability(Abc_Ntk_t *, int, int)");
  }
  if (pNtkRel->nObjCounts[8] != 0) {
    __assert_fail("Abc_NtkLatchNum(pNtkRel) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcQuant.c"
                  ,0x151,"Abc_Ntk_t *Abc_NtkReachability(Abc_Ntk_t *, int, int)");
  }
  if ((pNtkRel->vPis->nSize & 1) != 0) {
    __assert_fail("Abc_NtkPiNum(pNtkRel) % 2 == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcQuant.c"
                  ,0x152,"Abc_Ntk_t *Abc_NtkReachability(Abc_Ntk_t *, int, int)");
  }
  pAVar3 = Abc_NtkInitialState(pNtkRel);
  pNtkReached = Abc_NtkDup(pAVar3);
  uVar1 = (long)pNtkRel->vPis->nSize / 2;
  local_48 = uVar1 & 0xffffffff;
  uVar8 = (uint)uVar1;
  uVar9 = 0;
  if (0 < (int)uVar8) {
    uVar9 = uVar8;
  }
  local_58 = 0;
  if (0 < nIters) {
    local_58 = nIters;
  }
  uVar8 = 0;
  local_60 = nIters;
  local_40 = pNtkRel;
  do {
    if (uVar8 == local_58) {
      iVar2 = 0x7a9b7e;
      fprintf(_stdout,"Reachability analysis stopped after %d iterations.\n",(ulong)local_60);
LAB_002abfde:
      pAVar3 = pNtkReached;
      pAVar4 = Abc_NtkPo(pNtkReached,iVar2);
      pAVar4->field_0x15 = pAVar4->field_0x15 ^ 4;
      iVar2 = (int)local_48;
      i = iVar2 * 2;
      while( true ) {
        if (i <= iVar2) {
          iVar2 = Abc_NtkCheck(pAVar3);
          if (iVar2 == 0) {
            puts("Abc_NtkReachability: The network check has failed.");
            Abc_NtkDelete(pAVar3);
            pAVar3 = (Abc_Ntk_t *)0x0;
          }
          return pAVar3;
        }
        i = i + -1;
        pAVar4 = Abc_NtkPi(pAVar3,i);
        if ((pAVar4->vFanouts).nSize != 0) break;
        Abc_NtkDeleteObj(pAVar4);
      }
      __assert_fail("Abc_ObjFanoutNum(pObj) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcQuant.c"
                    ,0x1a0,"Abc_Ntk_t *Abc_NtkReachability(Abc_Ntk_t *, int, int)");
    }
    local_54 = pAVar3->nObjCounts[7];
    local_64 = uVar8;
    local_38 = Abc_Clock();
    uVar8 = 0;
    uVar7 = 0;
    pNtkNext = Abc_NtkMiterAnd(local_40,pAVar3,0,0);
    Abc_NtkDelete(pAVar3);
    while( true ) {
      pAVar3 = pNtkNext;
      iVar2 = 1;
      if (uVar9 == uVar8) break;
      Abc_NtkQuantify(pNtkNext,0,uVar8,(int)uVar7);
      if ((uVar8 / 3) * 3 + 2 == uVar8) {
        Abc_NtkCleanData(pAVar3);
        Abc_AigCleanup((Abc_Aig_t *)pAVar3->pManFunc);
        Abc_NtkSynthesize(&pNtkNext,1);
      }
      uVar8 = uVar8 + 1;
    }
    Abc_NtkCleanData(pNtkNext);
    Abc_AigCleanup((Abc_Aig_t *)pAVar3->pManFunc);
    Abc_NtkSynthesize(&pNtkNext,1);
    pAVar3 = pNtkNext;
    pNtk = Abc_NtkSwapVariables(pNtkNext);
    pNtkNext = pNtk;
    Abc_NtkDelete(pAVar3);
    pAVar4 = Abc_NtkPo(pNtk,iVar2);
    pAVar4 = (Abc_Obj_t *)pAVar4->pNtk->vObjs->pArray[*(pAVar4->vFanins).pArray];
    pAVar5 = Abc_AigConst1(pNtk);
    pAVar3 = pNtkReached;
    if (pAVar4 == pAVar5) {
      puts("Fixed point is reached!");
      Abc_NtkDelete(pNtk);
      goto LAB_002abfde;
    }
    pNtk2 = Abc_NtkMiterAnd(pNtk,pNtkReached,0,1);
    local_50 = pNtk2;
    Abc_NtkDelete(pNtk);
    pNtkReached = Abc_NtkMiterAnd(pAVar3,pNtk2,1,0);
    Abc_NtkDelete(pAVar3);
    Abc_NtkSynthesize(&local_50,1);
    Abc_NtkSynthesize(&pNtkReached,1);
    pAVar3 = local_50;
    if (local_5c == 0) {
      uVar8 = local_64 + 1;
    }
    else {
      uVar8 = local_64 + 1;
      iVar2 = 0x7a9b46;
      printf("I = %3d : Reach = %6d  Fr = %6d  FrM = %6d  %7.2f %%   ",
             ((double)(local_50->nObjCounts[7] - local_54) * 100.0) / (double)local_54,(ulong)uVar8,
             (ulong)(uint)pNtkReached->nObjCounts[7]);
      Abc_Print(iVar2,"%s =","T");
      aVar6 = Abc_Clock();
      Abc_Print(iVar2,"%9.2f sec\n",(double)(aVar6 - local_38) / 1000000.0);
    }
  } while( true );
}

Assistant:

Abc_Ntk_t * Abc_NtkReachability( Abc_Ntk_t * pNtkRel, int nIters, int fVerbose )
{
    Abc_Obj_t * pObj;
    Abc_Ntk_t * pNtkFront, * pNtkReached, * pNtkNext, * pNtkTemp;
    int i, v, nVars, nNodesOld, nNodesNew, nNodesPrev;
    int fFixedPoint = 0;
    int fSynthesis  = 1;
    int fMoreEffort = 1;
    abctime clk;

    assert( Abc_NtkIsStrash(pNtkRel) );
    assert( Abc_NtkLatchNum(pNtkRel) == 0 );
    assert( Abc_NtkPiNum(pNtkRel) % 2 == 0 );

    // compute the network composed of the initial states
    pNtkFront = Abc_NtkInitialState( pNtkRel );
    pNtkReached = Abc_NtkDup( pNtkFront );
//Abc_NtkShow( pNtkReached, 0, 0, 0 );

//    if ( fVerbose )
//        printf( "Transition relation = %6d.\n", Abc_NtkNodeNum(pNtkRel) );

    // perform iterations of reachability analysis
    nNodesPrev = Abc_NtkNodeNum(pNtkFront);
    nVars = Abc_NtkPiNum(pNtkRel)/2;
    for ( i = 0; i < nIters; i++ )
    {
        clk = Abc_Clock();
        // get the set of next states
        pNtkNext = Abc_NtkMiterAnd( pNtkRel, pNtkFront, 0, 0 );
        Abc_NtkDelete( pNtkFront );
        // quantify the current state variables
        for ( v = 0; v < nVars; v++ )
        {
            Abc_NtkQuantify( pNtkNext, 0, v, fVerbose );
            if ( fSynthesis && (v % 3 == 2) )
            {
                Abc_NtkCleanData( pNtkNext );
                Abc_AigCleanup( (Abc_Aig_t *)pNtkNext->pManFunc );
                Abc_NtkSynthesize( &pNtkNext, fMoreEffort );
            }
        }
        Abc_NtkCleanData( pNtkNext );
        Abc_AigCleanup( (Abc_Aig_t *)pNtkNext->pManFunc );
        if ( fSynthesis )
            Abc_NtkSynthesize( &pNtkNext, 1 );
        // map the next states into the current states
        pNtkNext = Abc_NtkSwapVariables( pNtkTemp = pNtkNext );
        Abc_NtkDelete( pNtkTemp );
        // check the termination condition
        if ( Abc_ObjFanin0(Abc_NtkPo(pNtkNext,0)) == Abc_AigConst1(pNtkNext) )
        {
            fFixedPoint = 1;
            printf( "Fixed point is reached!\n" );
            Abc_NtkDelete( pNtkNext );
            break;
        }
        // compute new front
        pNtkFront = Abc_NtkMiterAnd( pNtkNext, pNtkReached, 0, 1 );
        Abc_NtkDelete( pNtkNext );
        // add the reached states
        pNtkReached = Abc_NtkMiterAnd( pNtkTemp = pNtkReached, pNtkFront, 1, 0 );
        Abc_NtkDelete( pNtkTemp );
        // compress the size of Front
        nNodesOld = Abc_NtkNodeNum(pNtkFront);
        if ( fSynthesis )
        {
            Abc_NtkSynthesize( &pNtkFront, fMoreEffort );
            Abc_NtkSynthesize( &pNtkReached, fMoreEffort );
        }
        nNodesNew = Abc_NtkNodeNum(pNtkFront);
        // print statistics
        if ( fVerbose )
        {
            printf( "I = %3d : Reach = %6d  Fr = %6d  FrM = %6d  %7.2f %%   ", 
                i + 1, Abc_NtkNodeNum(pNtkReached), nNodesOld, nNodesNew, 100.0*(nNodesNew-nNodesPrev)/nNodesPrev );
            ABC_PRT( "T", Abc_Clock() - clk );
        }
        nNodesPrev = Abc_NtkNodeNum(pNtkFront);
    }
    if ( !fFixedPoint )
        fprintf( stdout, "Reachability analysis stopped after %d iterations.\n", nIters );

    // complement the output to represent the set of unreachable states
    Abc_ObjXorFaninC( Abc_NtkPo(pNtkReached,0), 0 );

    // remove next state variables
    for ( i = 2*nVars - 1; i >= nVars; i-- )
    {
        pObj = Abc_NtkPi( pNtkReached, i );
        assert( Abc_ObjFanoutNum(pObj) == 0 );
        Abc_NtkDeleteObj( pObj );
    }

    // check consistency of the network
    if ( !Abc_NtkCheck( pNtkReached ) )
    {
        printf( "Abc_NtkReachability: The network check has failed.\n" );
        Abc_NtkDelete( pNtkReached );
        return NULL;
    }
    return pNtkReached;
}